

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::ReadBuffersResponse_Slice::ReadBuffersResponse_Slice
          (ReadBuffersResponse_Slice *this,ReadBuffersResponse_Slice *param_1)

{
  ReadBuffersResponse_Slice *param_1_local;
  ReadBuffersResponse_Slice *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj,&param_1->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__ReadBuffersResponse_Slice_009c2ec8;
  ::std::__cxx11::string::string((string *)&this->data_,(string *)&param_1->data_);
  this->last_slice_for_packet_ = (bool)(param_1->last_slice_for_packet_ & 1);
  ::std::__cxx11::string::string
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

ReadBuffersResponse_Slice::ReadBuffersResponse_Slice(const ReadBuffersResponse_Slice&) = default;